

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O0

void __thiscall Client::resultChecks(Client *this,Result *result)

{
  undefined1 uVar1;
  Result *in_RSI;
  char *in_RDI;
  undefined7 in_stack_fffffffffffffec8;
  string local_128 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  char (*in_stack_ffffffffffffff18) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char (*in_stack_ffffffffffffff28) [14];
  string local_d0 [7];
  undefined1 in_stack_ffffffffffffff37;
  string local_b0 [28];
  Error in_stack_ffffffffffffff6c;
  string local_90 [32];
  string local_70 [32];
  string local_50 [8];
  Result *in_stack_ffffffffffffffb8;
  Client *in_stack_ffffffffffffffc0;
  string local_30 [32];
  Result *local_10;
  
  local_10 = in_RSI;
  uVar1 = httplib::Result::operator_cast_to_bool((Result *)0x11da61);
  httplib::Result::error(local_10);
  httplib::to_string_abi_cxx11_(in_stack_ffffffffffffff6c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
             (allocator<char> *)in_stack_fffffffffffffef0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffec8),in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffec8),in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffec8),in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffec8),in_RDI);
  std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((bool)in_stack_ffffffffffffff37,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  std::__cxx11::string::~string(local_30);
  httplib::Result::operator->((Result *)0x11dbe9);
  httplib::Result::operator->((Result *)0x11dc04);
  check<std::__cxx11::string_const&>
            ((bool)in_stack_ffffffffffffff17,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  check_rateLimit(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void resultChecks(const httplib::Result& result) {
        check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
        check(result->status == 200, result->reason);
        check_rateLimit(result);
    }